

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ri_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  ushort uVar1;
  SSL *pSVar2;
  bool bVar3;
  int iVar4;
  uchar *data;
  size_t len;
  undefined1 local_98 [8];
  CBB prev_finished;
  CBB contents;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  pSVar2 = hs->ssl;
  if ((hs->min_version < 0x304) && (type != ssl_client_hello_inner)) {
    uVar1 = *(ushort *)&pSVar2->s3->field_0xdc;
    bVar3 = InplaceVector<unsigned_char,_12UL>::empty(&pSVar2->s3->previous_client_finished);
    if (((byte)(uVar1 >> 4) & 1) != ((bVar3 ^ 0xffU) & 1)) {
      __assert_fail("ssl->s3->initial_handshake_complete == !ssl->s3->previous_client_finished.empty()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x2b2,
                    "bool bssl::ext_ri_add_clienthello(const SSL_HANDSHAKE *, CBB *, CBB *, ssl_client_hello_type_t)"
                   );
    }
    iVar4 = CBB_add_u16(out,0xff01);
    if (((iVar4 != 0) &&
        (iVar4 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&prev_finished.u + 0x18)), iVar4 != 0
        )) && (iVar4 = CBB_add_u8_length_prefixed
                                 ((CBB *)((long)&prev_finished.u + 0x18),(CBB *)local_98),
              iVar4 != 0)) {
      data = InplaceVector<unsigned_char,_12UL>::data(&pSVar2->s3->previous_client_finished);
      len = InplaceVector<unsigned_char,_12UL>::size(&pSVar2->s3->previous_client_finished);
      iVar4 = CBB_add_bytes((CBB *)local_98,data,len);
      if ((iVar4 != 0) && (iVar4 = CBB_flush(out), iVar4 != 0)) {
        return true;
      }
    }
    hs_local._7_1_ = false;
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ri_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                   CBB *out_compressible,
                                   ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // Renegotiation indication is not necessary in TLS 1.3.
  if (hs->min_version >= TLS1_3_VERSION ||  //
      type == ssl_client_hello_inner) {
    return true;
  }

  assert(ssl->s3->initial_handshake_complete ==
         !ssl->s3->previous_client_finished.empty());

  CBB contents, prev_finished;
  if (!CBB_add_u16(out, TLSEXT_TYPE_renegotiate) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &prev_finished) ||
      !CBB_add_bytes(&prev_finished, ssl->s3->previous_client_finished.data(),
                     ssl->s3->previous_client_finished.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}